

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::ClassNamePrefix<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,string *classname,EnumDescriptor *desc)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  char *pcVar6;
  
  plVar1 = *(long **)(*(long *)(*(long *)(desc + 0x10) + 0xa0) + 0x98);
  iVar3 = std::__cxx11::string::compare((char *)plVar1);
  if (iVar3 == 0) {
    bVar2 = true;
    do {
      bVar5 = bVar2;
      iVar3 = std::__cxx11::string::compare((char *)classname);
      if (iVar3 == 0) {
        iVar3 = std::__cxx11::string::compare(*(char **)(*(long *)(desc + 0x10) + 8));
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (iVar3 == 0) {
          pcVar6 = "GPB";
        }
        else {
          pcVar6 = "PB";
        }
        pcVar4 = "";
        goto LAB_0023a959;
      }
      bVar2 = false;
    } while (bVar5);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "";
    pcVar6 = "";
LAB_0023a959:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar4);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNamePrefix(const string& classname,
                            const DescriptorType* desc) {
  const string& prefix = (desc->file()->options()).php_class_prefix();
  if (prefix != "") {
    return prefix;
  }

  bool is_reserved = false;

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (classname == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  if (is_reserved) {
    if (desc->file()->package() == "google.protobuf") {
      return "GPB";
    } else {
      return "PB";
    }
  }

  return "";
}